

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

int Aig_TransferMappedClasses(Aig_Man_t *pAig,Aig_Man_t *pPart,int *pMapBack)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  
  iVar5 = 0;
  if ((pPart->pReprs != (Aig_Obj_t **)0x0) && (pVVar7 = pPart->vObjs, iVar5 = 0, 0 < pVVar7->nSize))
  {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if (pVVar7->pArray[lVar6] != (void *)0x0) {
        iVar1 = *(int *)((long)pVVar7->pArray[lVar6] + 0x24);
        if (pPart->pReprs[iVar1] != (Aig_Obj_t *)0x0) {
          pVVar7 = pAig->vObjs;
          if (pVVar7 == (Vec_Ptr_t *)0x0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar2 = pMapBack[iVar1];
            if (((int)uVar2 < 0) || (pVVar7->nSize <= (int)uVar2)) goto LAB_0063ad16;
            pAVar8 = (Aig_Obj_t *)pVVar7->pArray[uVar2];
          }
          if (pVVar7 == (Vec_Ptr_t *)0x0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar2 = pMapBack[pPart->pReprs[iVar1]->Id];
            if (((int)uVar2 < 0) || (pVVar7->nSize <= (int)uVar2)) {
LAB_0063ad16:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pAVar9 = (Aig_Obj_t *)pVVar7->pArray[uVar2];
          }
          if (pAig->pReprs == (Aig_Obj_t **)0x0) {
            __assert_fail("p->pReprs != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6b,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (((ulong)pAVar8 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pNode1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6c,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (((ulong)pAVar9 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pNode2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6d,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar1 = pAVar8->Id;
          if (pAig->nReprsAlloc <= iVar1) {
            __assert_fail("pNode1->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6e,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar3 = pAVar9->Id;
          if (pAig->nReprsAlloc <= iVar3) {
            __assert_fail("pNode2->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6f,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar5 = iVar5 + 1;
          if (pAVar8 != pAVar9) {
            iVar4 = iVar3;
            if (iVar3 < iVar1) {
              iVar4 = iVar1;
            }
            if (iVar1 < iVar3) {
              pAVar9 = pAVar8;
            }
            pAig->pReprs[iVar4] = pAVar9;
          }
        }
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pPart->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  return iVar5;
}

Assistant:

int Aig_TransferMappedClasses( Aig_Man_t * pAig, Aig_Man_t * pPart, int * pMapBack )
{
    Aig_Obj_t * pObj;
    int nClasses, k;
    nClasses = 0;
    if ( pPart->pReprs ) {
      Aig_ManForEachObj( pPart, pObj, k )
      {
          if ( pPart->pReprs[pObj->Id] == NULL )
              continue;
          nClasses++;
          Aig_ObjSetRepr_( pAig,
              Aig_ManObj(pAig, pMapBack[pObj->Id]),
              Aig_ManObj(pAig, pMapBack[pPart->pReprs[pObj->Id]->Id]) );
      }
    }
    return nClasses;
}